

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

LatticeComparison __thiscall
wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>_>::compare
          (Stack<wasm::analysis::Flat<unsigned_int>_> *this,Element *a,Element *b)

{
  byte bVar1;
  byte bVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer pEVar5;
  uint uVar6;
  LatticeComparison LVar7;
  
  pEVar3 = (a->
           super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (a->
           super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pEVar5 = (b->
           super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  LVar7 = EQUAL;
  if (pEVar5 != (b->
                super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                )._M_impl.super__Vector_impl_data._M_start || pEVar4 != pEVar3) {
    if (pEVar4 == pEVar3) {
      LVar7 = LESS;
    }
    else {
      if (pEVar5 != (b->
                    super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                    )._M_impl.super__Vector_impl_data._M_start) {
        bVar1 = *(__index_type *)
                 ((long)&pEVar4[-1].
                         super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                 + 4);
        uVar6 = 2;
        bVar2 = *(__index_type *)
                 ((long)&pEVar5[-1].
                         super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                         .
                         super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                 + 4);
        if (((bVar2 <= bVar1) && (uVar6 = 3, bVar1 <= bVar2)) &&
           ((bVar1 != 1 ||
            (uVar6 = 0,
            *(int *)&pEVar4[-1].
                     super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            == *(int *)&pEVar5[-1].
                        super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                        .
                        super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                        .
                        super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                        .
                        super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                        .
                        super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                        .
                        super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                        .
                        super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            )))) {
          uVar6 = 1;
        }
        LVar7 = (*(code *)((long)&DAT_0026f1a0 + (long)(int)(&DAT_0026f1a0)[uVar6]))();
        return LVar7;
      }
      LVar7 = GREATER;
    }
  }
  return LVar7;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    auto result = EQUAL;
    // Iterate starting from the end of the vectors to match up the tops of
    // stacks with different sizes.
    for (auto itA = a.rbegin(), itB = b.rbegin();
         itA != a.rend() || itB != b.rend();
         ++itA, ++itB) {
      if (itA == a.rend()) {
        // The rest of A's elements are bottom, but B has a non-bottom element
        // because of our invariant that the base of the materialized stack must
        // not be bottom.
        return LESS;
      }
      if (itB == b.rend()) {
        // The rest of B's elements are bottom, but A has a non-bottom element.
        return GREATER;
      }
      switch (lattice.compare(*itA, *itB)) {
        case NO_RELATION:
          return NO_RELATION;
        case EQUAL:
          continue;
        case LESS:
          if (result == GREATER) {
            // Cannot be both less and greater.
            return NO_RELATION;
          }
          result = LESS;
          continue;
        case GREATER:
          if (result == LESS) {
            // Cannot be both greater and less.
            return NO_RELATION;
          }
          result = GREATER;
          continue;
      }
    }
    return result;
  }